

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void nrn_list(Item *q1,Item *q2)

{
  short *psVar1;
  char *__s1;
  Item *pIVar2;
  int iVar3;
  int *piVar4;
  List *s;
  Item *pIVar5;
  List **ppLVar6;
  
  switch(((q1->element).sym)->type) {
  case 0x157:
    mechname = ((q2->element).sym)->name;
    __s1 = ((q1->element).sym)->name;
    iVar3 = strcmp(__s1,"POINT_PROCESS");
    if (iVar3 == 0) {
      piVar4 = &point_process;
    }
    else {
      iVar3 = strcmp(__s1,"ARTIFICIAL_CELL");
      if (iVar3 != 0) goto LAB_00108c91;
      point_process = 1;
      piVar4 = &artificial_cell;
    }
    *piVar4 = 1;
LAB_00108c91:
    set_suffix();
    return;
  case 0x15e:
    pIVar2 = q2->next;
    while (q1 = q1->next, q1 != pIVar2) {
      psVar1 = &((q1->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x140;
    }
    break;
  case 0x15f:
    diag("NEURON SECTION variables not implemented",(char *)0x0);
  case 0x160:
    pIVar2 = q2->next;
    while (q1 = q1->next, q1 != pIVar2) {
      psVar1 = &((q1->element).sym)->nrntype;
      *psVar1 = *psVar1 | 8;
    }
    break;
  case 0x161:
    threadsafe("Use of POINTER is not thread safe.");
    pIVar2 = q2->next;
    ppLVar6 = &nrnpointers;
    pIVar5 = q1;
    while (pIVar5 = pIVar5->next, pIVar5 != pIVar2) {
      psVar1 = &((pIVar5->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x900;
    }
    goto LAB_00108bc9;
  case 0x162:
    threadsafe("Use of BBCOREPOINTER is not thread safe.");
    pIVar2 = q2->next;
    pIVar5 = q1;
    while (pIVar5 = pIVar5->next, pIVar5 != pIVar2) {
      psVar1 = &((pIVar5->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x2100;
    }
    use_bbcorepointer = 1;
    ppLVar6 = &nrnpointers;
    goto LAB_00108bc9;
  case 0x163:
    threadsafe("Use of EXTERNAL is not thread safe.");
    pIVar2 = q2->next;
    while (q1 = q1->next, q1 != pIVar2) {
      psVar1 = &((q1->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x101;
    }
    break;
  case 0x167:
    electrode_current = 1;
  case 0x158:
    pIVar2 = q2->next;
    ppLVar6 = &currents;
    pIVar5 = q1;
    while (pIVar5 = pIVar5->next, pIVar5 != pIVar2) {
      psVar1 = &((pIVar5->element).sym)->nrntype;
      *psVar1 = *psVar1 | 8;
    }
LAB_00108bc9:
    s = *ppLVar6;
    if (s == (List *)0x0) {
      s = newlist();
      *ppLVar6 = s;
    }
    if (q1 != q2) {
      movelist(q1->next,q2,s);
      return;
    }
    __assert_fail("q1 != q2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                  ,0x7d8,"void nrn_list()");
  }
  return;
}

Assistant:

void nrn_list(q1, q2)
	Item *q1, *q2;
{
	List **plist = (List **)0;
	Item *q;
		
	switch (SYM(q1)->type) {
	case RANGE:
		plist = (List **)0;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNRANGE;
		}
		break;
	case SUFFIX:
		plist = (List **)0;
		mechname = SYM(q2)->name;
		if (strcmp(SYM(q1)->name, "POINT_PROCESS") == 0) {
			point_process = 1;
		}else if (strcmp(SYM(q1)->name, "ARTIFICIAL_CELL") == 0) {
			point_process = 1;
			artificial_cell = 1;
		}
		set_suffix();
		break;
	case ELECTRODE_CURRENT:
		electrode_current = 1;
	case NONSPECIFIC:
		plist = &currents;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNRANGE;
		}
		break;
	case SECTION:
		diag("NEURON SECTION variables not implemented", (char *)0);
		break;
	case GLOBAL:
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNGLOBAL | NRNNOTP;
		}
		plist = (List **)0;
		break;
	case EXTERNAL:
#if VECTORIZE
threadsafe("Use of EXTERNAL is not thread safe.");
#endif
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNEXTRN | NRNNOTP;
		}
		plist = (List **)0;
		break;
	case POINTER:
threadsafe("Use of POINTER is not thread safe.");
		plist = &nrnpointers;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNNOTP | NRNPOINTER;
		}
		break;
	case BBCOREPOINTER:
threadsafe("Use of BBCOREPOINTER is not thread safe.");
		plist = &nrnpointers;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNNOTP | NRNBBCOREPOINTER;
		}
		use_bbcorepointer = 1;
		break;
	}
	if (plist) {
		if (!*plist) {
			*plist = newlist();
		}
		assert (q1 != q2);
		movelist(q1->next, q2, *plist);
	}
}